

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O1

void __thiscall CConnman::SetTryNewOutboundPeer(CConnman *this,bool flag)

{
  string_view source_file;
  bool bVar1;
  Logger *pLVar2;
  char **args;
  long in_FS_OFFSET;
  string_view str;
  string_view logging_function;
  string log_msg;
  char **local_d8 [10];
  undefined8 local_88;
  char *pcStack_80;
  string local_68;
  char *local_48;
  size_t local_40;
  char local_38;
  undefined7 uStack_37;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  LOCK();
  (this->m_try_another_outbound_peer)._M_base._M_i = flag;
  UNLOCK();
  pLVar2 = LogInstance();
  bVar1 = BCLog::Logger::WillLogCategoryLevel(pLVar2,NET,Debug);
  if (bVar1) {
    args = (char **)0x11270b1;
    if (flag) {
      args = (char **)0x11442fd;
    }
    local_d8[0] = args;
    pLVar2 = LogInstance();
    bVar1 = BCLog::Logger::Enabled(pLVar2);
    if (bVar1) {
      local_40 = 0;
      local_38 = '\0';
      local_48 = &local_38;
      tinyformat::format<char_const*>
                (&local_68,(tinyformat *)"setting try another outbound peer=%s\n",(char *)local_d8,
                 args);
      SetTryNewOutboundPeer();
      pLVar2 = LogInstance();
      local_88 = 0x50;
      pcStack_80 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/net.cpp";
      source_file._M_str =
           "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/net.cpp";
      source_file._M_len = 0x50;
      str._M_str = local_48;
      str._M_len = local_40;
      logging_function._M_str = "SetTryNewOutboundPeer";
      logging_function._M_len = 0x15;
      BCLog::Logger::LogPrintStr(pLVar2,str,logging_function,source_file,0x939,NET,Debug);
      if (local_48 != &local_38) {
        operator_delete(local_48,CONCAT71(uStack_37,local_38) + 1);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CConnman::SetTryNewOutboundPeer(bool flag)
{
    m_try_another_outbound_peer = flag;
    LogDebug(BCLog::NET, "setting try another outbound peer=%s\n", flag ? "true" : "false");
}